

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O1

void __thiscall
Assimp::XFileExporter::XFileExporter
          (XFileExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  pointer pcVar1;
  locale alStack_68 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  stringstream *local_50;
  string *local_48;
  string *local_40;
  locale local_38 [8];
  
  this->_vptr_XFileExporter = (_func_int **)&PTR__XFileExporter_009be908;
  local_50 = &this->mOutput;
  std::__cxx11::stringstream::stringstream((stringstream *)local_50);
  this->mProperties = pProperties;
  this->mIOSystem = pIOSystem;
  local_58 = &(this->mPath).field_2;
  (this->mPath)._M_dataplus._M_p = (pointer)local_58;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mPath,pcVar1,pcVar1 + path->_M_string_length);
  local_60 = &(this->mFile).field_2;
  (this->mFile)._M_dataplus._M_p = (pointer)local_60;
  pcVar1 = (file->_M_dataplus)._M_p;
  local_40 = &this->mPath;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFile,pcVar1,pcVar1 + file->_M_string_length);
  this->mScene = pScene;
  this->mSceneOwned = false;
  (this->startstr)._M_dataplus._M_p = (pointer)&(this->startstr).field_2;
  (this->startstr)._M_string_length = 0;
  (this->startstr).field_2._M_local_buf[0] = '\0';
  (this->endstr)._M_dataplus._M_p = (pointer)&(this->endstr).field_2;
  local_48 = &this->mFile;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->endstr,"\n","");
  std::locale::locale(alStack_68,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale(alStack_68);
  *(undefined8 *)(&this->field_0x10 + *(long *)(*(long *)&this->mOutput + -0x18)) = 8;
  WriteFile(this);
  return;
}

Assistant:

XFileExporter::XFileExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file, const ExportProperties* pProperties)
        : mProperties(pProperties),
        mIOSystem(pIOSystem),
        mPath(path),
        mFile(file),
        mScene(pScene),
        mSceneOwned(false),
        endstr("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}